

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var __thiscall
Js::InterpreterStackFrame::
OP_LdInnerSlot<Js::OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
          (InterpreterStackFrame *this,Var slotArray,
          OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
          *playout)

{
  Var pvVar1;
  OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
  *playout_local;
  Var slotArray_local;
  InterpreterStackFrame *this_local;
  
  pvVar1 = OP_LdSlot(this,slotArray,
                     (uint)(playout->
                           super_OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
                           SlotIndex2);
  return pvVar1;
}

Assistant:

Var InterpreterStackFrame::OP_LdInnerSlot(Var slotArray, const unaligned T* playout)
    {
        return OP_LdSlot(slotArray, playout->SlotIndex2);
    }